

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

int VerifyRSA::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  size_t MsgHash;
  uchar *rsa;
  bool bVar1;
  ulong uVar2;
  char *Msg;
  size_t MsgLen;
  bool local_41;
  bool result;
  size_t sStack_40;
  bool authentic;
  size_t encMessageLength;
  uchar *encMessage;
  RSA *publicRSA;
  char *signatureBase64_local;
  string *plainText_local;
  string *publicKey_local;
  
  publicRSA = (RSA *)siglen;
  signatureBase64_local = (char *)sig;
  plainText_local = (string *)ctx;
  uVar2 = std::__cxx11::string::find((char *)ctx,0x103020);
  if (uVar2 == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      encMessage = (uchar *)createPublicRSA((string *)ctx);
      Base64Decode((char *)publicRSA,(uchar **)&encMessageLength,&stack0xffffffffffffffc0);
      rsa = encMessage;
      MsgHash = encMessageLength;
      Msg = (char *)std::__cxx11::string::c_str();
      MsgLen = std::__cxx11::string::length();
      bVar1 = RSAVerifySignature((RSA *)rsa,(uchar *)MsgHash,sStack_40,Msg,MsgLen,&local_41);
      free((void *)encMessageLength);
      publicKey_local._7_1_ = (bVar1 & local_41 & 1U) != 0;
      uVar2 = 0;
      goto LAB_00102bae;
    }
  }
  publicKey_local._7_1_ = false;
LAB_00102bae:
  return (int)CONCAT71((int7)(uVar2 >> 8),publicKey_local._7_1_);
}

Assistant:

bool VerifyRSA::verify(std::string publicKey, std::string plainText, char *signatureBase64)
{
    if (publicKey.find("-----BEGIN RSA PUBLIC KEY-----",0)!=0 ||
        plainText.empty())
    {
        return false;
    }
    if (sizeof(signatureBase64)<1) {
        std::cerr << "Not a valid signature!" << std::endl;
        return false;
    }
    RSA* publicRSA = createPublicRSA(publicKey);
    unsigned char* encMessage;
    size_t encMessageLength;
    bool authentic;
    Base64Decode(signatureBase64, &encMessage, &encMessageLength);
    bool result = RSAVerifySignature(publicRSA, encMessage, encMessageLength, plainText.c_str(), plainText.length(), &authentic);
    free(encMessage);
    return result & authentic;
}